

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O3

pair<sjtu::orderType,_long> * __thiscall
sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::load
          (LRUCache<std::pair<sjtu::orderType,_long>_> *this,locType *offset)

{
  Node *pNVar1;
  long lVar2;
  CacheNode *pCVar3;
  CacheNode *pCVar4;
  Node *pNVar5;
  CacheNode *this_00;
  CacheNode *pCVar6;
  CacheNode **ppCVar7;
  pair<sjtu::orderType,_long> ret;
  pair<sjtu::orderType,_long> pStack_d8;
  
  this->attempt_count = this->attempt_count + 1;
  pNVar1 = (this->table).nil;
  pNVar5 = pNVar1->left;
  if (pNVar5 != pNVar1) {
    do {
      lVar2 = pNVar5->value->first;
      if (lVar2 == *offset) break;
      pNVar5 = (&pNVar5->left)[lVar2 <= *offset];
    } while (pNVar5 != pNVar1);
  }
  if (pNVar5 == pNVar1) {
    this->miss_count = this->miss_count + 1;
    this_00 = (CacheNode *)operator_new(0xe8);
    memset(&pStack_d8,0,0xc0);
    std::istream::seekg(this->file,*offset,0);
    std::istream::read((char *)this->file,(long)&pStack_d8);
    CacheNode::CacheNode(this_00,&pStack_d8,offset,this);
    if (this->block_lim == (this->table).tot) {
      pCVar6 = this->tail;
      pCVar3 = pCVar6->prec;
      this->tail = pCVar3;
      ppCVar7 = &pCVar3->succ;
      if (pCVar3 == (CacheNode *)0x0) {
        ppCVar7 = &this->head;
      }
      *ppCVar7 = (CacheNode *)0x0;
      CacheNode::~CacheNode(pCVar6);
      operator_delete(pCVar6,0xe8);
    }
    pCVar6 = this->head;
    if (pCVar6 == (CacheNode *)0x0) {
      this->tail = this_00;
      goto LAB_0011984e;
    }
  }
  else {
    this_00 = pNVar5->value->second;
    pCVar6 = this->head;
    if (this_00 == pCVar6) {
      return &this_00->value;
    }
    pCVar3 = this_00->prec;
    pCVar4 = this_00->succ;
    pCVar3->succ = pCVar4;
    ppCVar7 = &pCVar4->prec;
    if (pCVar4 == (CacheNode *)0x0) {
      ppCVar7 = &this->tail;
    }
    *ppCVar7 = pCVar3;
    this_00->prec = (CacheNode *)0x0;
  }
  this_00->succ = pCVar6;
  pCVar6->prec = this_00;
LAB_0011984e:
  this->head = this_00;
  return &this_00->value;
}

Assistant:

valueType *load(const locType &offset)
		{
			++ attempt_count;
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			CacheNode *node;
			if (it == table.end())
			{
				++ miss_count;
				node = new CacheNode (f_read(offset) , offset , this);
				if (block_lim == table.size())
				{
					CacheNode *tmp = tail;
					if (tail = tail -> prec) tail -> succ = nullptr;
					else  head = nullptr;
					delete tmp;
				}
				if (head == nullptr) head = tail = node;
				else (node -> succ = head) -> prec = node , head = node;
			}
			else
			{
				node = it -> second;
				if (node != head)
				{
					node -> prec -> succ = node -> succ;
					if (node -> succ) node -> succ -> prec = node -> prec;
					else tail = node -> prec;
					node -> prec = nullptr , (node -> succ = head) -> prec = node , head = node;
				}
			}
			return &(node -> value);
		}